

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O0

AsyncJob<int> * pbrt::RunAsync<pbrt::GUI::RefreshDisplay()::__0,pbrt::Image,int&>(void)

{
  int iVar1;
  AsyncJob<int> *w;
  unique_lock<std::mutex> lock;
  AsyncJob<int> *job;
  type fvoid;
  int *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  anon_class_1_0_00000001_for__M_f *in_stack_fffffffffffffed8;
  AsyncJob<int> *__u;
  AsyncJob<int> *in_stack_fffffffffffffee0;
  ThreadPool *in_stack_fffffffffffffee8;
  AsyncJob<int> *in_stack_fffffffffffffef0;
  
  std::bind<pbrt::GUI::RefreshDisplay()::__0&,pbrt::Image,int&>
            (in_stack_fffffffffffffed8,
             (Image *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
  w = (AsyncJob<int> *)operator_new(0xb0);
  std::function<int()>::function<std::_Bind<pbrt::GUI::RefreshDisplay()::__0(pbrt::Image,int)>,void>
            ((function<int_()> *)in_stack_fffffffffffffee0,
             (_Bind<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mmp[P]pbrt_v4_src_pbrt_util_gui_cpp:314:17)_(pbrt::Image,_int)>
              *)w);
  AsyncJob<int>::AsyncJob(in_stack_fffffffffffffee0,(function<int_()> *)w);
  std::function<int_()>::~function((function<int_()> *)0x50df20);
  __u = w;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&stack0xfffffffffffffef0);
  iVar1 = RunningThreads();
  if (iVar1 == 1) {
    AsyncJob<int>::DoWork(in_stack_fffffffffffffef0);
  }
  else {
    ThreadPool::AddToJobList
              (in_stack_fffffffffffffee8,&in_stack_fffffffffffffee0->super_ParallelJob);
    std::unique_lock<std::mutex>::operator=
              ((unique_lock<std::mutex> *)in_stack_fffffffffffffee0,(unique_lock<std::mutex> *)__u);
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)CONCAT44(iVar1,in_stack_fffffffffffffed0));
  }
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)CONCAT44(iVar1,in_stack_fffffffffffffed0));
  std::
  _Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/util/gui.cpp:314:17)_(pbrt::Image,_int)>
  ::~_Bind((_Bind<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mmp[P]pbrt_v4_src_pbrt_util_gui_cpp:314:17)_(pbrt::Image,_int)>
            *)0x50e01d);
  return w;
}

Assistant:

inline auto RunAsync(F func, Args &&...args) {
    // Create _AsyncJob_ for _func_ and _args_
    auto fvoid = std::bind(func, std::forward<Args>(args)...);
    using R = typename std::invoke_result_t<F, Args...>;
    AsyncJob<R> *job = new AsyncJob<R>(std::move(fvoid));

    // Enqueue _job_ or run it immediately
    std::unique_lock<std::mutex> lock;
    if (RunningThreads() == 1)
        job->DoWork();
    else
        lock = ParallelJob::threadPool->AddToJobList(job);

    return job;
}